

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O1

EffectAnalyzer * __thiscall wasm::Pusher::getPushableEffects(Pusher *this,LocalSet *pushable)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false> _Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  pair<std::__detail::_Node_iterator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false,_false>,_bool>
  pVar7;
  LocalSet *local_18;
  LocalSet *pushable_local;
  
  uVar1 = (this->pushableEffects)._M_h._M_bucket_count;
  uVar4 = (ulong)pushable % uVar1;
  p_Var5 = (this->pushableEffects)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (LocalSet *)p_Var5->_M_nxt[1]._M_nxt != pushable)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (LocalSet *)p_Var2[1]._M_nxt == pushable)) goto LAB_00690fde;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00690fde:
  if (p_Var6 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (_Var3._M_cur == (__node_type *)0x0) {
    local_18 = pushable;
    pVar7 = std::__detail::
            _Insert_base<wasm::LocalSet*,std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>,std::__detail::_Select1st,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::try_emplace<wasm::LocalSet*const&,wasm::PassOptions&,wasm::Module&,wasm::LocalSet*&>
                      ((_Insert_base<wasm::LocalSet*,std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>,std::__detail::_Select1st,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->pushableEffects,(const_iterator)0x0,&local_18,this->passOptions,
                       this->module,&local_18);
    _Var3._M_cur = (__node_type *)
                   pVar7.first.
                   super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>
                   ._M_cur;
  }
  return (EffectAnalyzer *)
         ((long)&((_Var3._M_cur)->
                 super__Hash_node_value<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

const EffectAnalyzer& getPushableEffects(LocalSet* pushable) {
    auto iter = pushableEffects.find(pushable);
    if (iter == pushableEffects.end()) {
      iter =
        pushableEffects.try_emplace(pushable, passOptions, module, pushable)
          .first;
    }
    return iter->second;
  }